

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

void __thiscall crnlib::corpus_tester::flush_bad_blocks(corpus_tester *this)

{
  int iVar1;
  char *pcVar2;
  color_quad<unsigned_char,_int> *c;
  dynamic_string *in_RDI;
  dynamic_string filename;
  int in_stack_00000168;
  uint in_stack_0000016c;
  image_u8 *in_stack_00000170;
  char *in_stack_00000178;
  dynamic_string *this_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_01;
  
  iVar1._0_2_ = in_RDI[3].m_buf_size;
  iVar1._2_2_ = in_RDI[3].m_len;
  if (iVar1 != 0) {
    this_01 = (image<crnlib::color_quad<unsigned_char,_int>_> *)&stack0xffffffffffffffe8;
    dynamic_string::dynamic_string
              ((dynamic_string *)this_01,cVarArg,"badblocks_%u.tga",
               (ulong)*(uint *)&in_RDI[3].field_0x4);
    pcVar2 = dynamic_string::get_ptr((dynamic_string *)this_01);
    console::printf("Writing bad block image: %s",pcVar2);
    c = (color_quad<unsigned_char,_int> *)
        dynamic_string::get_ptr((dynamic_string *)&stack0xffffffffffffffe8);
    image_utils::write_to_file
              (in_stack_00000178,in_stack_00000170,in_stack_0000016c,in_stack_00000168);
    this_00 = in_RDI;
    color_quad<unsigned_char,_int>::make_black();
    image<crnlib::color_quad<unsigned_char,_int>_>::set_all(this_01,c);
    *(int *)&in_RDI[3].field_0x4 = *(int *)&in_RDI[3].field_0x4 + 1;
    in_RDI[3].m_buf_size = 0;
    in_RDI[3].m_len = 0;
    dynamic_string::~dynamic_string(this_00);
  }
  return;
}

Assistant:

void corpus_tester::flush_bad_blocks() {
  if (!m_next_bad_block_index)
    return;

  dynamic_string filename(cVarArg, "badblocks_%u.tga", m_total_bad_block_files);
  console::printf("Writing bad block image: %s", filename.get_ptr());
  image_utils::write_to_file(filename.get_ptr(), m_bad_block_img, image_utils::cWriteFlagIgnoreAlpha);

  m_bad_block_img.set_all(color_quad_u8::make_black());

  m_total_bad_block_files++;

  m_next_bad_block_index = 0;
}